

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::overwriteRwSetting
          (ChainImpl *this,string *name,SettingsValue *value,bool write)

{
  int iVar1;
  long in_FS_OFFSET;
  SettingsValue *local_38;
  undefined1 *puStack_30;
  code *local_28;
  code *pcStack_20;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = write;
  if (value->typ == VNULL) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar1 = (*(this->super_Chain)._vptr_Chain[0x33])(this,name,(ulong)write);
      return SUB41(iVar1,0);
    }
  }
  else {
    puStack_30 = &local_11;
    pcStack_20 = std::
                 _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:834:38)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:834:38)>
               ::_M_manager;
    local_38 = value;
    iVar1 = (*(this->super_Chain)._vptr_Chain[0x31])(this,name,&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,3);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return SUB41(iVar1,0);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool overwriteRwSetting(const std::string& name, common::SettingsValue& value, bool write) override
    {
        if (value.isNull()) return deleteRwSettings(name, write);
        return updateRwSetting(name, [&](common::SettingsValue& settings) {
            settings = std::move(value);
            return write ? interfaces::SettingsAction::WRITE : interfaces::SettingsAction::SKIP_WRITE;
        });
    }